

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roadmap.cpp
# Opt level: O3

void setPreferredVelocities(RVOSimulator *sim)

{
  Vector2 VVar1;
  pointer pRVar2;
  pointer pRVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  Vector2 *pVVar8;
  Vector2 *point1;
  size_t sVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float local_64;
  Vector2 local_60;
  undefined1 local_58 [16];
  float local_48;
  
  sVar7 = RVO::RVOSimulator::getNumAgents(sim);
  if (0 < (int)sVar7) {
    sVar7 = 0;
    do {
      if ((int)((ulong)((long)roadmap.
                              super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)roadmap.
                             super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249 < 1) {
LAB_0010535d:
        local_60.x_ = 0.0;
        local_60.y_ = 0.0;
      }
      else {
        local_58._0_4_ = 0xffffffff;
        lVar11 = 0;
        lVar10 = 0;
        local_64 = 9e+09;
        do {
          pRVar2 = roadmap.super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>._M_impl
                   .super__Vector_impl_data._M_start;
          pVVar8 = RVO::RVOSimulator::getAgentPosition(sim,sVar7);
          fVar12 = *(float *)((long)&(pRVar2->position).x_ + lVar11) - pVVar8->x_;
          fVar13 = *(float *)((long)&(pRVar2->position).y_ + lVar11) - pVVar8->y_;
          if (SQRT(fVar12 * fVar12 + fVar13 * fVar13) +
              *(float *)(*(long *)((long)&((roadmap.
                                            super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->distToGoal).
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_start + lVar11) +
                        (long)goals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[sVar7] * 4) < local_64) {
            point1 = RVO::RVOSimulator::getAgentPosition(sim,sVar7);
            pVVar8 = &(roadmap.super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>.
                       _M_impl.super__Vector_impl_data._M_start)->position;
            fVar12 = RVO::RVOSimulator::getAgentRadius(sim,sVar7);
            bVar5 = RVO::RVOSimulator::queryVisibility
                              (sim,point1,(Vector2 *)((long)&pVVar8->x_ + lVar11),fVar12);
            pRVar2 = roadmap.super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (bVar5) {
              pVVar8 = RVO::RVOSimulator::getAgentPosition(sim,sVar7);
              fVar12 = *(float *)((long)&(pRVar2->position).x_ + lVar11) - pVVar8->x_;
              fVar13 = *(float *)((long)&(pRVar2->position).y_ + lVar11) - pVVar8->y_;
              local_64 = SQRT(fVar12 * fVar12 + fVar13 * fVar13) +
                         *(float *)(*(long *)((long)&((roadmap.
                                                  super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  distToGoal).
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar11)
                                   + (long)goals.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start[sVar7] * 4);
              local_58._0_4_ = (int)lVar10;
            }
          }
          pRVar2 = roadmap.super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>._M_impl
                   .super__Vector_impl_data._M_start;
          lVar10 = lVar10 + 1;
          lVar11 = lVar11 + 0x38;
        } while (lVar10 < (int)((ulong)((long)roadmap.
                                              super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)roadmap.
                                             super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x49249249);
        uVar4 = local_58._0_4_;
        if (local_58._0_4_ == -1) goto LAB_0010535d;
        lVar10 = (long)(int)local_58._0_4_;
        pVVar8 = RVO::RVOSimulator::getAgentPosition(sim,sVar7);
        pRVar3 = roadmap.super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>._M_impl.
                 super__Vector_impl_data._M_start;
        fVar12 = pRVar2[lVar10].position.x_ - pVVar8->x_;
        fVar13 = pRVar2[lVar10].position.y_ - pVVar8->y_;
        fVar12 = fVar12 * fVar12 + fVar13 * fVar13;
        if ((fVar12 != 0.0) || (NAN(fVar12))) {
          pVVar8 = RVO::RVOSimulator::getAgentPosition(sim,sVar7);
          VVar1 = pRVar3[lVar10].position;
          fVar12 = VVar1.x_;
          fVar13 = VVar1.y_;
        }
        else {
          iVar6 = goals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[sVar7];
          if (uVar4 == iVar6) goto LAB_0010535d;
          pVVar8 = RVO::RVOSimulator::getAgentPosition(sim,sVar7);
          VVar1 = pRVar3[iVar6].position;
          fVar12 = VVar1.x_;
          fVar13 = VVar1.y_;
        }
        fVar12 = fVar12 - (*pVVar8).x_;
        fVar13 = fVar13 - (*pVVar8).y_;
        fVar14 = 1.0 / SQRT(fVar12 * fVar12 + fVar13 * fVar13);
        local_60.y_ = fVar14 * fVar13;
        local_60.x_ = fVar14 * fVar12;
      }
      RVO::RVOSimulator::setAgentPrefVelocity(sim,sVar7,&local_60);
      iVar6 = rand();
      fVar12 = (((float)iVar6 + (float)iVar6) * 3.1415927) / 2.1474836e+09;
      iVar6 = rand();
      local_58 = ZEXT416((uint)((float)iVar6 * 0.0001 * 4.656613e-10));
      pVVar8 = RVO::RVOSimulator::getAgentPrefVelocity(sim,sVar7);
      local_48 = cosf(fVar12);
      fVar12 = sinf(fVar12);
      local_60.y_ = (*pVVar8).y_ + (float)local_58._0_4_ * fVar12;
      local_60.x_ = (*pVVar8).x_ + (float)local_58._0_4_ * local_48;
      RVO::RVOSimulator::setAgentPrefVelocity(sim,sVar7,&local_60);
      sVar7 = sVar7 + 1;
      sVar9 = RVO::RVOSimulator::getNumAgents(sim);
    } while ((long)sVar7 < (long)(int)sVar9);
  }
  return;
}

Assistant:

void setPreferredVelocities(RVO::RVOSimulator *sim)
{
	/*
	 * Set the preferred velocity to be a vector of unit magnitude (speed) in the
	 * direction of the visible roadmap vertex that is on the shortest path to the
	 * goal.
	 */
#ifdef _OPENMP
#pragma omp parallel for
#endif
	for (int i = 0; i < static_cast<int>(sim->getNumAgents()); ++i) {
		float minDist = 9e9f;
		int minVertex = -1;

		for (int j = 0; j < static_cast<int>(roadmap.size()); ++j) {
			if (RVO::abs(roadmap[j].position - sim->getAgentPosition(i)) + roadmap[j].distToGoal[goals[i]] < minDist &&
				sim->queryVisibility(sim->getAgentPosition(i), roadmap[j].position, sim->getAgentRadius(i))) {

				minDist = RVO::abs(roadmap[j].position - sim->getAgentPosition(i)) + roadmap[j].distToGoal[goals[i]];
				minVertex = j;
			}
		}

		if (minVertex == -1) {
			/* No roadmap vertex is visible; should not happen. */
			sim->setAgentPrefVelocity(i, RVO::Vector2(0, 0));
		}
		else {
			if (RVO::absSq(roadmap[minVertex].position -
			               sim->getAgentPosition(i)) == 0.0f) {
				if (minVertex == goals[i]) {
					sim->setAgentPrefVelocity(i, RVO::Vector2());
				}
				else {
					sim->setAgentPrefVelocity(i, RVO::normalize(roadmap[goals[i]].position - sim->getAgentPosition(i)));
				}
			}
			else {
				sim->setAgentPrefVelocity(i, RVO::normalize(roadmap[minVertex].position - sim->getAgentPosition(i)));
			}
		}

		/*
		 * Perturb a little to avoid deadlocks due to perfect symmetry.
		 */
		float angle = std::rand() * 2.0f * M_PI / RAND_MAX;
		float dist = std::rand() * 0.0001f / RAND_MAX;

		sim->setAgentPrefVelocity(i, sim->getAgentPrefVelocity(i) +
		                          dist * RVO::Vector2(std::cos(angle), std::sin(angle)));
	}
}